

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O0

exr_result_t internal_exr_apply_rle(exr_encode_pipeline_t *encode)

{
  uint64_t packedbytes;
  exr_result_t eVar1;
  long in_RDI;
  uint64_t srcb;
  uint64_t outb;
  exr_result_t rv;
  undefined8 local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  packedbytes = *(uint64_t *)(in_RDI + 0x70);
  eVar1 = internal_encode_alloc_buffer
                    (encode,rv,(void **)outb,(size_t *)srcb,
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (eVar1 == 0) {
    reorder_and_predict(*(void **)(in_RDI + 0xc0),*(void **)(in_RDI + 0x68),packedbytes);
    local_20 = internal_rle_compress
                         (*(void **)(in_RDI + 0xa8),*(uint64_t *)(in_RDI + 0xb8),
                          *(void **)(in_RDI + 0xc0),packedbytes);
    if (packedbytes <= local_20) {
      memcpy(*(void **)(in_RDI + 0xa8),*(void **)(in_RDI + 0x68),packedbytes);
      local_20 = packedbytes;
    }
    *(uint64_t *)(in_RDI + 0xb0) = local_20;
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_apply_rle (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;
    uint64_t     outb, srcb;

    srcb = encode->packed_bytes;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        srcb);
    if (rv != EXR_ERR_SUCCESS) return rv;

    reorder_and_predict (encode->scratch_buffer_1, encode->packed_buffer, srcb);

    outb = internal_rle_compress (
        encode->compressed_buffer,
        encode->compressed_alloc_size,
        encode->scratch_buffer_1,
        srcb);

    if (outb >= srcb)
    {
        memcpy (encode->compressed_buffer, encode->packed_buffer, srcb);
        outb = srcb;
    }
    encode->compressed_bytes = outb;
    return EXR_ERR_SUCCESS;
}